

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O3

void __thiscall
KillDeathRatioIRCCommand::trigger
          (KillDeathRatioIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  undefined8 *puVar1;
  char *pcVar2;
  undefined8 uVar3;
  char cVar4;
  long lVar5;
  ulong uVar6;
  size_t sVar7;
  uint uVar8;
  double dVar9;
  basic_string_view<char,_std::char_traits<char>_> in_string;
  string msg;
  string playerName;
  undefined1 local_a0 [16];
  time_point local_90;
  _Alloc_hider local_88;
  size_type local_80;
  undefined8 local_70;
  _Alloc_hider local_68;
  char *local_60;
  undefined8 local_58;
  
  local_68._M_p = (pointer)channel._M_len;
  if (parameters._M_len == 0) {
    Jupiter::IRC::Client::sendNotice
              (source,nick._M_len,nick._M_str,0x31,
               "Error: Too Few Parameters. Syntax: Kills <Player>");
    return;
  }
  lVar5 = Jupiter::IRC::Client::getChannel(source,local_68._M_p,channel._M_str);
  if (lVar5 != 0) {
    local_70 = channel._M_str;
    Jupiter::IRC::Client::Channel::getType();
    local_a0[0] = 0;
    uVar8 = 0;
    local_60 = nick._M_str;
    local_58 = nick._M_len;
    while( true ) {
      uVar3 = local_58;
      pcVar2 = local_60;
      RenX::getCore();
      uVar6 = RenX::Core::getServerCount();
      if (uVar6 == uVar8) break;
      uVar6 = RenX::getCore();
      lVar5 = RenX::Core::getServer(uVar6);
      cVar4 = RenX::Server::isLogChanType((int)lVar5);
      if ((cVar4 != '\0') && (*(long *)(lVar5 + 0x20) != 0)) {
        for (puVar1 = *(undefined8 **)(lVar5 + 0x10); puVar1 != (undefined8 *)(lVar5 + 0x10);
            puVar1 = (undefined8 *)*puVar1) {
          in_string._M_str = (char *)puVar1[3];
          in_string._M_len = puVar1[4];
          sVar7 = jessilib::find<char,char,false>(in_string,parameters);
          if (sVar7 != 0xffffffffffffffff) {
            RenX::getFormattedPlayerName_abi_cxx11_((PlayerInfo *)&stack0xffffffffffffff70);
            dVar9 = 1.0;
            if (*(uint *)((long)puVar1 + 0x13c) != 0) {
              dVar9 = (double)*(uint *)((long)puVar1 + 0x13c);
            }
            string_printf_abi_cxx11_
                      ((string *)&stack0xffffffffffffffb0,
                       "\x02%.*s\x02\x03: Kills: %u - Deaths: %u - KDR: %.2f",
                       (double)*(uint *)(puVar1 + 0x27) / dVar9,local_88._M_p,local_90.__d.__r);
            trigger();
            Jupiter::IRC::Client::sendMessage(source,local_68._M_p,local_70,0,local_a0);
            if (local_90.__d.__r != (duration)&stack0xffffffffffffff80) {
              operator_delete((void *)local_90.__d.__r,local_80 + 1);
            }
          }
        }
      }
      uVar8 = uVar8 + 1;
    }
    Jupiter::IRC::Client::sendNotice(source,uVar3,pcVar2,0x18,"Error: Player not found.");
  }
  return;
}

Assistant:

void KillDeathRatioIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	if (!parameters.empty()) {
		Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
		if (chan != nullptr) {
			int type = chan->getType();
			std::string msg;
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++) {
				RenX::Server *server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type) && server->players.size() != 0) {
					for (auto node = server->players.begin(); node != server->players.end(); ++node) {
						if (jessilib::findi(node->name, parameters) != std::string::npos) {
							std::string playerName = RenX::getFormattedPlayerName(*node);
							msg = string_printf(IRCBOLD "%.*s" IRCBOLD IRCCOLOR ": Kills: %u - Deaths: %u - KDR: %.2f", playerName.size(),
								playerName.data(), node->kills, node->deaths, static_cast<double>(node->kills) / (node->deaths == 0 ? 1.0f : static_cast<double>(node->deaths)));
							source->sendMessage(channel, msg);
						}
					}
				}
			}
			if (msg.empty())
				source->sendNotice(nick, "Error: Player not found."sv);
		}
	}
	else source->sendNotice(nick, "Error: Too Few Parameters. Syntax: Kills <Player>"sv);
}